

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.h
# Opt level: O2

void __thiscall google::protobuf::TextFormat::ParseInfoTree::ParseInfoTree(ParseInfoTree *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->locations_)._M_t._M_impl.super__Rb_tree_header;
  (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nested_)._M_t._M_impl.super__Rb_tree_header;
  (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ParseInfoTree(const ParseInfoTree&) = delete;